

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

UINT16 TPMU_SYM_MODE_Marshal(TPMU_SYM_MODE *source,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT32 selector_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMU_SYM_MODE *source_local;
  
  switch(selector) {
  case 3:
    source_local._6_2_ = UINT16_Marshal(&source->tdes,buffer,size);
    break;
  default:
    source_local._6_2_ = 0;
    break;
  case 6:
    source_local._6_2_ = UINT16_Marshal(&source->tdes,buffer,size);
    break;
  case 10:
    source_local._6_2_ = 0;
    break;
  case 0x10:
    source_local._6_2_ = 0;
  }
  return source_local._6_2_;
}

Assistant:

UINT16
TPMU_SYM_MODE_Marshal(TPMU_SYM_MODE *source, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_TDES
        case TPM_ALG_TDES:
            return TPMI_ALG_SYM_MODE_Marshal((TPMI_ALG_SYM_MODE *)&(source->tdes), buffer, size);
#endif // ALG_TDES
#if         ALG_AES
        case TPM_ALG_AES:
            return TPMI_ALG_SYM_MODE_Marshal((TPMI_ALG_SYM_MODE *)&(source->aes), buffer, size);
#endif // ALG_AES
#if         ALG_SM4
        case TPM_ALG_SM4:
            return TPMI_ALG_SYM_MODE_Marshal((TPMI_ALG_SYM_MODE *)&(source->sm4), buffer, size);
#endif // ALG_SM4
#if         ALG_CAMELLIA
        case TPM_ALG_CAMELLIA:
            return TPMI_ALG_SYM_MODE_Marshal((TPMI_ALG_SYM_MODE *)&(source->camellia), buffer, size);
#endif // ALG_CAMELLIA
#if         ALG_XOR
        case TPM_ALG_XOR:
            return 0;
#endif // ALG_XOR
        case TPM_ALG_NULL:
            return 0;
    }
    return 0;
}